

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

void Abc_NtkPermute(Abc_Ntk_t *pNtk,int fInputs,int fOutputs,int fFlops,char *pFlopPermFile)

{
  void **ppvVar1;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  ulong uVar9;
  Vec_Int_t *pVVar10;
  int *__ptr;
  ulong uVar11;
  Vec_Int_t *__ptr_00;
  uint uVar12;
  uint uVar13;
  int iVar14;
  Vec_Ptr_t *pVVar15;
  Vec_Ptr_t *pVVar16;
  Vec_Ptr_t *pVVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  
  pVVar16 = (Vec_Ptr_t *)(ulong)(uint)fInputs;
  uVar5 = pNtk->nObjCounts[8];
  pVVar17 = (Vec_Ptr_t *)(ulong)uVar5;
  if (pFlopPermFile == (char *)0x0) {
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    uVar12 = 0x10;
    if (0xe < uVar5 - 1) {
      uVar12 = uVar5;
    }
    pVVar6->nSize = 0;
    pVVar6->nCap = uVar12;
    if (uVar12 == 0) {
      piVar8 = (int *)0x0;
    }
    else {
      piVar8 = (int *)malloc((long)(int)uVar12 << 2);
    }
    pVVar6->pArray = piVar8;
    pVVar6->nSize = uVar5;
    if (0 < (int)uVar5) {
      pVVar15 = (Vec_Ptr_t *)0x0;
      do {
        piVar8[(long)pVVar15] = (int)pVVar15;
        pVVar15 = (Vec_Ptr_t *)((long)&pVVar15->nCap + 1);
      } while (pVVar17 != pVVar15);
    }
    bVar21 = fInputs == 0;
    bVar22 = fOutputs == 0;
    bVar23 = fFlops == 0;
  }
  else {
    pVVar6 = Abc_NtkReadFlopPerm(pFlopPermFile,uVar5);
    if (pVVar6 == (Vec_Int_t *)0x0) {
      return;
    }
    bVar23 = true;
    bVar22 = true;
    bVar21 = true;
    pVVar16 = pVVar17;
  }
  uVar5 = pNtk->vPis->nSize;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar12 = 0x10;
  if (0xe < uVar5 - 1) {
    uVar12 = uVar5;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = uVar12;
  if (uVar12 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)(int)uVar12 << 2);
  }
  pVVar7->pArray = piVar8;
  pVVar7->nSize = uVar5;
  if (0 < (int)uVar5) {
    uVar9 = 0;
    do {
      piVar8[uVar9] = (int)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  uVar12 = pNtk->vPos->nSize;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  uVar13 = 0x10;
  if (0xe < uVar12 - 1) {
    uVar13 = uVar12;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = uVar13;
  if (uVar13 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)(int)uVar13 << 2);
  }
  pVVar10->pArray = __ptr;
  pVVar10->nSize = uVar12;
  if (0 < (int)uVar12) {
    uVar9 = 0;
    do {
      __ptr[uVar9] = (int)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
  }
  if ((!bVar21) && (0 < pNtk->vPis->nSize)) {
    uVar19 = 0;
    uVar9 = 0;
    if (0 < (int)uVar5) {
      uVar9 = (ulong)uVar5;
    }
    do {
      iVar4 = rand();
      pVVar16 = pNtk->vPis;
      uVar11 = (long)iVar4 % (long)pVVar16->nSize;
      if (((uVar9 == uVar19) || (iVar4 = (int)uVar11, iVar4 < 0)) || ((int)uVar5 <= iVar4))
      goto LAB_00862e63;
      iVar14 = piVar8[uVar19];
      uVar11 = uVar11 & 0xffffffff;
      piVar8[uVar19] = piVar8[uVar11];
      piVar8[uVar11] = iVar14;
      if (((long)pVVar16->nSize <= (long)uVar19) || (pVVar16->nSize <= iVar4)) goto LAB_00862e25;
      ppvVar1 = pVVar16->pArray;
      pvVar2 = ppvVar1[uVar19];
      ppvVar1[uVar19] = ppvVar1[uVar11];
      if (pNtk->vPis->nSize <= iVar4) goto LAB_00862e44;
      pNtk->vPis->pArray[uVar11] = pvVar2;
      iVar14 = pNtk->vCis->nSize;
      if (((long)iVar14 <= (long)uVar19) || (iVar14 <= iVar4)) goto LAB_00862e25;
      ppvVar1 = pNtk->vCis->pArray;
      pvVar2 = ppvVar1[uVar19];
      ppvVar1[uVar19] = ppvVar1[uVar11];
      pVVar16 = pNtk->vCis;
      if (pVVar16->nSize <= iVar4) goto LAB_00862e44;
      pVVar16->pArray[uVar11] = pvVar2;
      uVar19 = uVar19 + 1;
    } while ((long)uVar19 < (long)pNtk->vPis->nSize);
  }
  if ((!bVar22) && (0 < pNtk->vPos->nSize)) {
    uVar9 = 0;
    uVar19 = 0;
    if (0 < (int)uVar12) {
      uVar19 = (ulong)uVar12;
    }
    do {
      iVar4 = rand();
      pVVar16 = pNtk->vPos;
      uVar11 = (long)iVar4 % (long)pVVar16->nSize;
      if (((uVar19 == uVar9) || (iVar4 = (int)uVar11, iVar4 < 0)) || ((int)uVar12 <= iVar4))
      goto LAB_00862e63;
      iVar14 = __ptr[uVar9];
      uVar11 = uVar11 & 0xffffffff;
      __ptr[uVar9] = __ptr[uVar11];
      __ptr[uVar11] = iVar14;
      if (((long)pVVar16->nSize <= (long)uVar9) || (pVVar16->nSize <= iVar4)) goto LAB_00862e25;
      ppvVar1 = pVVar16->pArray;
      pvVar2 = ppvVar1[uVar9];
      ppvVar1[uVar9] = ppvVar1[uVar11];
      if (pNtk->vPos->nSize <= iVar4) goto LAB_00862e44;
      pNtk->vPos->pArray[uVar11] = pvVar2;
      iVar14 = pNtk->vCos->nSize;
      if (((long)iVar14 <= (long)uVar9) || (iVar14 <= iVar4)) goto LAB_00862e25;
      ppvVar1 = pNtk->vCos->pArray;
      pvVar2 = ppvVar1[uVar9];
      ppvVar1[uVar9] = ppvVar1[uVar11];
      pVVar16 = pNtk->vCos;
      if (pVVar16->nSize <= iVar4) goto LAB_00862e44;
      pVVar16->pArray[uVar11] = pvVar2;
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)pNtk->vPos->nSize);
  }
  if (pNtk->vBoxes->nSize != pNtk->nObjCounts[8]) {
    __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                  ,0x7e4,"void Abc_NtkPermute(Abc_Ntk_t *, int, int, int, char *)");
  }
  if ((!bVar23) && (0 < pNtk->nObjCounts[8])) {
    lVar20 = 0;
    do {
      iVar4 = rand();
      uVar9 = (long)iVar4 % (long)pNtk->nObjCounts[8];
      if (((pVVar6->nSize <= lVar20) || (iVar4 = (int)uVar9, iVar4 < 0)) || (pVVar6->nSize <= iVar4)
         ) {
LAB_00862e63:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = pVVar6->pArray;
      iVar14 = piVar3[lVar20];
      uVar9 = uVar9 & 0xffffffff;
      piVar3[lVar20] = piVar3[uVar9];
      piVar3[uVar9] = iVar14;
      iVar14 = pNtk->vBoxes->nSize;
      if ((iVar14 <= lVar20) || (iVar14 <= iVar4)) {
LAB_00862e25:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppvVar1 = pNtk->vBoxes->pArray;
      pvVar2 = ppvVar1[lVar20];
      ppvVar1[lVar20] = ppvVar1[uVar9];
      if (pNtk->vBoxes->nSize <= iVar4) {
LAB_00862e44:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      pNtk->vBoxes->pArray[uVar9] = pvVar2;
      uVar5 = pNtk->vPis->nSize;
      uVar9 = lVar20 + (ulong)uVar5;
      iVar14 = (int)uVar9;
      if (iVar14 < 0) goto LAB_00862e25;
      iVar18 = pNtk->vCis->nSize;
      if (((iVar18 <= iVar14) || (uVar5 = uVar5 + iVar4, (int)uVar5 < 0)) || (iVar18 <= (int)uVar5))
      goto LAB_00862e25;
      ppvVar1 = pNtk->vCis->pArray;
      uVar9 = uVar9 & 0xffffffff;
      pvVar2 = ppvVar1[uVar9];
      ppvVar1[uVar9] = ppvVar1[uVar5];
      uVar5 = pNtk->vPis->nSize + iVar4;
      if (((int)uVar5 < 0) || (pNtk->vCis->nSize <= (int)uVar5)) goto LAB_00862e44;
      pNtk->vCis->pArray[uVar5] = pvVar2;
      uVar5 = pNtk->vPos->nSize;
      uVar9 = lVar20 + (ulong)uVar5;
      iVar14 = (int)uVar9;
      if (iVar14 < 0) goto LAB_00862e25;
      iVar18 = pNtk->vCos->nSize;
      if (((iVar18 <= iVar14) || (uVar5 = uVar5 + iVar4, (int)uVar5 < 0)) || (iVar18 <= (int)uVar5))
      goto LAB_00862e25;
      pVVar16 = (Vec_Ptr_t *)pNtk->vCos->pArray;
      uVar9 = uVar9 & 0xffffffff;
      pvVar2 = *(void **)(&pVVar16->nCap + uVar9 * 2);
      *(undefined8 *)(&pVVar16->nCap + uVar9 * 2) =
           *(undefined8 *)(&pVVar16->nCap + (ulong)uVar5 * 2);
      uVar5 = pNtk->vPos->nSize + iVar4;
      if (((int)uVar5 < 0) || (pNtk->vCos->nSize <= (int)uVar5)) goto LAB_00862e44;
      pNtk->vCos->pArray[uVar5] = pvVar2;
      lVar20 = lVar20 + 1;
    } while (lVar20 < pNtk->nObjCounts[8]);
  }
  iVar4 = (int)pVVar16;
  __ptr_00 = Vec_IntInvert(pVVar7,iVar4);
  if (piVar8 != (int *)0x0) {
    free(piVar8);
    pVVar7->pArray = (int *)0x0;
  }
  free(pVVar7);
  pVVar7 = Vec_IntInvert(pVVar10,iVar4);
  if (__ptr != (int *)0x0) {
    free(__ptr);
    pVVar10->pArray = (int *)0x0;
  }
  free(pVVar10);
  pVVar10 = Vec_IntInvert(pVVar6,iVar4);
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  if (pNtk->vObjPerm != (Vec_Int_t *)0x0) {
    piVar8 = pNtk->vObjPerm->pArray;
    if (piVar8 != (int *)0x0) {
      free(piVar8);
      pNtk->vObjPerm->pArray = (int *)0x0;
    }
    if (pNtk->vObjPerm != (Vec_Int_t *)0x0) {
      free(pNtk->vObjPerm);
      pNtk->vObjPerm = (Vec_Int_t *)0x0;
    }
  }
  iVar18 = pNtk->vPos->nSize + pNtk->vPis->nSize;
  iVar4 = pNtk->nObjCounts[8];
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < (iVar4 + iVar18) - 1U) {
    iVar14 = iVar18 + iVar4;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar14;
  if (iVar14 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar14 << 2);
  }
  pVVar6->pArray = piVar8;
  pNtk->vObjPerm = pVVar6;
  iVar4 = __ptr_00->nSize;
  if (0 < (long)iVar4) {
    piVar8 = __ptr_00->pArray;
    lVar20 = 0;
    do {
      Vec_IntPush(pNtk->vObjPerm,piVar8[lVar20]);
      lVar20 = lVar20 + 1;
    } while (iVar4 != lVar20);
  }
  iVar4 = pVVar7->nSize;
  if (0 < (long)iVar4) {
    piVar8 = pVVar7->pArray;
    lVar20 = 0;
    do {
      Vec_IntPush(pNtk->vObjPerm,piVar8[lVar20]);
      lVar20 = lVar20 + 1;
    } while (iVar4 != lVar20);
  }
  iVar4 = pVVar10->nSize;
  if (0 < (long)iVar4) {
    piVar8 = pVVar10->pArray;
    lVar20 = 0;
    do {
      Vec_IntPush(pNtk->vObjPerm,piVar8[lVar20]);
      lVar20 = lVar20 + 1;
    } while (iVar4 != lVar20);
  }
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (int *)0x0;
  }
  if (__ptr_00 != (Vec_Int_t *)0x0) {
    free(__ptr_00);
  }
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  if (pVVar7 != (Vec_Int_t *)0x0) {
    free(pVVar7);
  }
  if (pVVar10->pArray != (int *)0x0) {
    free(pVVar10->pArray);
    pVVar10->pArray = (int *)0x0;
  }
  if (pVVar10 == (Vec_Int_t *)0x0) {
    return;
  }
  free(pVVar10);
  return;
}

Assistant:

void Abc_NtkPermute( Abc_Ntk_t * pNtk, int fInputs, int fOutputs, int fFlops, char * pFlopPermFile )
{
    Abc_Obj_t * pTemp;
    Vec_Int_t * vInputs, * vOutputs, * vFlops, * vTemp;
    int i, k, Entry;
    // start permutation arrays
    if ( pFlopPermFile )
    {
        vFlops = Abc_NtkReadFlopPerm( pFlopPermFile, Abc_NtkLatchNum(pNtk) );
        if ( vFlops == NULL )
            return;
        fInputs  = 0;
        fOutputs = 0;
        fFlops   = 0;
    }
    else
        vFlops   = Vec_IntStartNatural( Abc_NtkLatchNum(pNtk) );
    vInputs  = Vec_IntStartNatural( Abc_NtkPiNum(pNtk) );
    vOutputs = Vec_IntStartNatural( Abc_NtkPoNum(pNtk) );
    // permute inputs
    if ( fInputs )
    for ( i = 0; i < Abc_NtkPiNum(pNtk); i++ )
    {
        k = rand() % Abc_NtkPiNum(pNtk);
        // swap indexes
        Entry = Vec_IntEntry( vInputs, i );
        Vec_IntWriteEntry( vInputs, i, Vec_IntEntry(vInputs, k) );
        Vec_IntWriteEntry( vInputs, k, Entry );
        // swap PIs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vPis, i );
        Vec_PtrWriteEntry( pNtk->vPis, i, Vec_PtrEntry(pNtk->vPis, k) );
        Vec_PtrWriteEntry( pNtk->vPis, k, pTemp );
        // swap CIs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCis, i );
        Vec_PtrWriteEntry( pNtk->vCis, i, Vec_PtrEntry(pNtk->vCis, k) );
        Vec_PtrWriteEntry( pNtk->vCis, k, pTemp );
//printf( "Swapping PIs %d and %d.\n", i, k );
    }
    // permute outputs
    if ( fOutputs )
    for ( i = 0; i < Abc_NtkPoNum(pNtk); i++ )
    {
        k = rand() % Abc_NtkPoNum(pNtk);
        // swap indexes
        Entry = Vec_IntEntry( vOutputs, i );
        Vec_IntWriteEntry( vOutputs, i, Vec_IntEntry(vOutputs, k) );
        Vec_IntWriteEntry( vOutputs, k, Entry );
        // swap POs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vPos, i );
        Vec_PtrWriteEntry( pNtk->vPos, i, Vec_PtrEntry(pNtk->vPos, k) );
        Vec_PtrWriteEntry( pNtk->vPos, k, pTemp );
        // swap COs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCos, i );
        Vec_PtrWriteEntry( pNtk->vCos, i, Vec_PtrEntry(pNtk->vCos, k) );
        Vec_PtrWriteEntry( pNtk->vCos, k, pTemp );
//printf( "Swapping POs %d and %d.\n", i, k );
    }
    // permute flops
    assert( Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk) );
    if ( fFlops )
    for ( i = 0; i < Abc_NtkLatchNum(pNtk); i++ )
    {
        k = rand() % Abc_NtkLatchNum(pNtk);
        // swap indexes
        Entry = Vec_IntEntry( vFlops, i );
        Vec_IntWriteEntry( vFlops, i, Vec_IntEntry(vFlops, k) );
        Vec_IntWriteEntry( vFlops, k, Entry );
        // swap flops
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vBoxes, i );
        Vec_PtrWriteEntry( pNtk->vBoxes, i, Vec_PtrEntry(pNtk->vBoxes, k) );
        Vec_PtrWriteEntry( pNtk->vBoxes, k, pTemp );
        // swap CIs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCis, Abc_NtkPiNum(pNtk)+i );
        Vec_PtrWriteEntry( pNtk->vCis, Abc_NtkPiNum(pNtk)+i, Vec_PtrEntry(pNtk->vCis, Abc_NtkPiNum(pNtk)+k) );
        Vec_PtrWriteEntry( pNtk->vCis, Abc_NtkPiNum(pNtk)+k, pTemp );
        // swap COs
        pTemp = (Abc_Obj_t *)Vec_PtrEntry( pNtk->vCos, Abc_NtkPoNum(pNtk)+i );
        Vec_PtrWriteEntry( pNtk->vCos, Abc_NtkPoNum(pNtk)+i, Vec_PtrEntry(pNtk->vCos, Abc_NtkPoNum(pNtk)+k) );
        Vec_PtrWriteEntry( pNtk->vCos, Abc_NtkPoNum(pNtk)+k, pTemp );

//printf( "Swapping flops %d and %d.\n", i, k );
    }
    // invert arrays
    vInputs = Vec_IntInvert( vTemp = vInputs, -1 );
    Vec_IntFree( vTemp );
    vOutputs = Vec_IntInvert( vTemp = vOutputs, -1 );
    Vec_IntFree( vTemp );
    vFlops = Vec_IntInvert( vTemp = vFlops, -1 );
    Vec_IntFree( vTemp );
    // pack the results into the output array
    Vec_IntFreeP( &pNtk->vObjPerm );
    pNtk->vObjPerm = Vec_IntAlloc( Abc_NtkPiNum(pNtk) + Abc_NtkPoNum(pNtk) + Abc_NtkLatchNum(pNtk) );
    Vec_IntForEachEntry( vInputs, Entry, i )
        Vec_IntPush( pNtk->vObjPerm, Entry );
    Vec_IntForEachEntry( vOutputs, Entry, i )
        Vec_IntPush( pNtk->vObjPerm, Entry );
    Vec_IntForEachEntry( vFlops, Entry, i )
        Vec_IntPush( pNtk->vObjPerm, Entry );
    // cleanup
    Vec_IntFree( vInputs );
    Vec_IntFree( vOutputs );
    Vec_IntFree( vFlops );
}